

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O0

void __thiscall
boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>::on<baryonyx::raw_problem>
          (reporter<boost::ext::ut::v1_1_8::printer> *this,
          assertion_fail<baryonyx::raw_problem> *assertion)

{
  printer *ppVar1;
  char *__str;
  colors *pcVar2;
  char local_4a [2];
  int local_48;
  char local_41;
  string_view local_40;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  anon_class_1_0_00000001 local_19;
  assertion_fail<baryonyx::raw_problem> *paStack_18;
  anon_class_1_0_00000001 short_name;
  assertion_fail<baryonyx::raw_problem> *assertion_local;
  reporter<boost::ext::ut::v1_1_8::printer> *this_local;
  
  local_19 = (anon_class_1_0_00000001)0x0;
  paStack_18 = assertion;
  ppVar1 = printer::operator<<(&this->printer_,(char (*) [4])"\n  ");
  __str = reflection::source_location::file_name(&assertion->location);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_40,__str);
  local_30 = on<baryonyx::raw_problem>::anon_class_1_0_00000001::operator()(&local_19,local_40);
  ppVar1 = printer::operator<<(ppVar1,&local_30);
  local_41 = ':';
  ppVar1 = printer::operator<<(ppVar1,&local_41);
  local_48 = reflection::source_location::line(&assertion->location);
  ppVar1 = printer::operator<<(ppVar1,&local_48);
  local_4a[1] = 0x3a;
  ppVar1 = printer::operator<<(ppVar1,local_4a + 1);
  pcVar2 = printer::colors(&this->printer_);
  ppVar1 = printer::operator<<(ppVar1,&pcVar2->fail);
  ppVar1 = printer::operator<<(ppVar1,(char (*) [7])"FAILED");
  pcVar2 = printer::colors(&this->printer_);
  ppVar1 = printer::operator<<(ppVar1,&pcVar2->none);
  ppVar1 = printer::operator<<(ppVar1,(char (*) [3])0xc7aebf);
  ppVar1 = printer::operator<<(ppVar1,std::boolalpha);
  ppVar1 = printer::operator<<(ppVar1,&assertion->expr);
  pcVar2 = printer::colors(&this->printer_);
  ppVar1 = printer::operator<<(ppVar1,&pcVar2->none);
  local_4a[0] = ']';
  printer::operator<<(ppVar1,local_4a);
  (this->asserts_).fail = (this->asserts_).fail + 1;
  return;
}

Assistant:

auto on(events::assertion_fail<TExpr> assertion) -> void {
      constexpr auto short_name = [](std::string_view name) {
        return name.rfind('/') != std::string_view::npos
                   ? name.substr(name.rfind('/') + 1)
                   : name;
      };
      printer_ << "\n  " << short_name(assertion.location.file_name()) << ':'
               << assertion.location.line() << ':' << printer_.colors().fail
               << "FAILED" << printer_.colors().none << " [" << std::boolalpha
               << assertion.expr << printer_.colors().none << ']';
      ++asserts_.fail;
    }